

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O1

int Eigen::internal::find_ordering<int>
              (int n_row,int n_col,int Alen,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,
              int *head,int n_col2,int max_deg,int pfree)

{
  colamd_col<int> *pcVar1;
  colamd_col<int> *pcVar2;
  int *piVar3;
  int *piVar4;
  colamd_col<int> *pcVar5;
  int iVar6;
  uint uVar7;
  anon_union_4_3_eabe2f71_for_shared3 aVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  anon_union_4_3_eabe2f71_for_shared3 *paVar20;
  long lVar21;
  anon_union_4_2_db423fdf_for_shared4 *paVar22;
  int iVar23;
  anon_union_4_2_a9a27649_for_shared2 *paVar24;
  int iVar25;
  ulong uVar26;
  int *piVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  anon_union_4_2_a9a27649_for_shared2 *paVar31;
  int *rp_end;
  int local_40;
  
  if (0 < n_row) {
    lVar15 = 0;
    do {
      if (-1 < *(int *)((long)&Row->shared2 + lVar15)) {
        *(undefined4 *)((long)&Row->shared2 + lVar15) = 0;
      }
      lVar15 = lVar15 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar15);
  }
  if (n_col2 < 1) {
    iVar13 = 0;
  }
  else {
    lVar15 = (ulong)(uint)n_row << 4;
    iVar12 = 1;
    iVar13 = 0;
    iVar23 = 0;
    iVar6 = 0;
    do {
      iVar25 = iVar6 + -1;
      lVar21 = (long)iVar6;
      do {
        lVar9 = lVar21;
        iVar6 = head[lVar9];
        iVar25 = iVar25 + 1;
        if (n_col <= lVar9) break;
        lVar21 = lVar9 + 1;
      } while (iVar6 == -1);
      iVar30 = Col[iVar6].shared4.degree_next;
      head[lVar9] = iVar30;
      if ((long)iVar30 != -1) {
        Col[iVar30].shared3.headhash = -1;
      }
      pcVar1 = Col + iVar6;
      iVar6 = (pcVar1->shared1).thickness;
      iVar30 = (pcVar1->shared2).score;
      (pcVar1->shared2).score = iVar23;
      iVar23 = iVar23 + iVar6;
      iVar18 = n_col - iVar23;
      if (iVar30 < n_col - iVar23) {
        iVar18 = iVar30;
      }
      if (iVar18 + pfree < Alen) {
        uVar28 = (ulong)(uint)pfree;
      }
      else {
        paVar24 = (anon_union_4_2_a9a27649_for_shared2 *)A;
        if (0 < n_col) {
          uVar28 = 0;
          do {
            uVar7 = Col[uVar28].start;
            if (-1 < (int)uVar7) {
              pcVar2 = Col + uVar28;
              pcVar2->start = (int)((ulong)((long)paVar24 - (long)A) >> 2);
              iVar12 = pcVar2->length;
              if (0 < iVar12) {
                lVar21 = 0;
                do {
                  if (-1 < Row[A[(ulong)uVar7 + lVar21]].shared2.mark) {
                    paVar24->mark = A[(ulong)uVar7 + lVar21];
                    paVar24 = paVar24 + 1;
                  }
                  lVar21 = lVar21 + 1;
                } while (iVar12 != (int)lVar21);
              }
              pcVar2->length = (int)((ulong)((long)paVar24 - (long)(A + (uint)pcVar2->start)) >> 2);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != (uint)n_col);
        }
        if (0 < n_row) {
          iVar12 = -1;
          lVar21 = 0;
          do {
            if (-1 < *(int *)((long)&Row->shared2 + lVar21)) {
              if (*(int *)((long)&Row->length + lVar21) == 0) {
                *(undefined4 *)((long)&Row->shared2 + lVar21) = 0xffffffff;
              }
              else {
                iVar30 = *(int *)((long)&Row->start + lVar21);
                *(int *)((long)&Row->shared2 + lVar21) = A[iVar30];
                A[iVar30] = iVar12;
              }
            }
            iVar12 = iVar12 + -1;
            lVar21 = lVar21 + 0x10;
          } while (lVar15 != lVar21);
        }
        paVar31 = paVar24;
        while (paVar24 < (anon_union_4_2_a9a27649_for_shared2 *)(A + pfree)) {
          if (paVar24->mark < 0) {
            uVar7 = ~paVar24->mark;
            *paVar24 = Row[uVar7].shared2;
            Row[uVar7].start = (int)((ulong)((long)paVar31 - (long)A) >> 2);
            iVar12 = Row[uVar7].length;
            if (0 < iVar12) {
              do {
                if (-1 < Col[paVar24->mark].start) {
                  paVar31->mark = paVar24->mark;
                  paVar31 = paVar31 + 1;
                }
                paVar24 = paVar24 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            Row[uVar7].length =
                 (int)((ulong)((long)paVar31 - (long)(A + (uint)Row[uVar7].start)) >> 2);
          }
          else {
            paVar24 = paVar24 + 1;
          }
        }
        uVar28 = (ulong)((long)paVar31 - (long)A) >> 2;
        iVar13 = iVar13 + 1;
        if (0 < n_row) {
          lVar21 = 0;
          do {
            if (-1 < *(int *)((long)&Row->shared2 + lVar21)) {
              *(undefined4 *)((long)&Row->shared2 + lVar21) = 0;
            }
            lVar21 = lVar21 + 0x10;
          } while (lVar15 != lVar21);
        }
        iVar12 = 1;
      }
      (pcVar1->shared1).thickness = -iVar6;
      piVar10 = A + pcVar1->start;
      piVar3 = piVar10 + pcVar1->length;
      rp_end._4_4_ = 0;
      uVar26 = uVar28 & 0xffffffff;
      while (piVar10 < piVar3) {
        iVar30 = *piVar10;
        piVar10 = piVar10 + 1;
        if (-1 < Row[iVar30].shared2.mark) {
          lVar21 = (long)Row[iVar30].length;
          if (0 < lVar21) {
            piVar11 = A + Row[iVar30].start;
            piVar16 = piVar11 + lVar21;
            do {
              iVar30 = *piVar11;
              iVar18 = Col[iVar30].shared1.thickness;
              if ((0 < iVar18) && (-1 < Col[iVar30].start)) {
                Col[iVar30].shared1.thickness = -iVar18;
                iVar14 = (int)uVar26;
                uVar26 = (ulong)(iVar14 + 1);
                A[iVar14] = iVar30;
                rp_end._4_4_ = rp_end._4_4_ + iVar18;
              }
              piVar11 = piVar11 + 1;
            } while (piVar11 < piVar16);
          }
        }
      }
      (pcVar1->shared1).thickness = iVar6;
      if (max_deg <= rp_end._4_4_) {
        max_deg = rp_end._4_4_;
      }
      if (0 < (long)pcVar1->length) {
        piVar10 = A + pcVar1->start;
        piVar3 = piVar10 + pcVar1->length;
        do {
          iVar6 = *piVar10;
          piVar10 = piVar10 + 1;
          Row[iVar6].shared2.mark = -1;
        } while (piVar10 < piVar3);
      }
      pfree = (int)uVar26;
      iVar30 = (int)uVar28;
      iVar6 = pfree - iVar30;
      if (iVar6 == 0 || pfree < iVar30) {
        local_40 = -1;
      }
      else {
        local_40 = A[pcVar1->start];
      }
      piVar10 = A + iVar30;
      piVar3 = piVar10 + iVar6;
      piVar11 = piVar10;
      if (0 < iVar6) {
        do {
          pcVar2 = Col + *piVar11;
          iVar18 = (pcVar2->shared1).thickness;
          iVar14 = (pcVar2->shared4).degree_next;
          (pcVar2->shared1).thickness = -iVar18;
          iVar29 = (pcVar2->shared3).headhash;
          if ((long)iVar29 == -1) {
            paVar22 = (anon_union_4_2_db423fdf_for_shared4 *)(head + (pcVar2->shared2).score);
          }
          else {
            paVar22 = &Col[iVar29].shared4;
          }
          paVar22->degree_next = iVar14;
          if (iVar14 != -1) {
            Col[iVar14].shared3.headhash = iVar29;
          }
          if (0 < (long)pcVar2->length) {
            piVar16 = A + pcVar2->start;
            piVar4 = piVar16 + pcVar2->length;
            do {
              iVar14 = *piVar16;
              if (-1 < Row[iVar14].shared2.mark) {
                iVar29 = Row[iVar14].shared2.mark - iVar12;
                if (iVar29 < 0) {
                  iVar29 = Row[iVar14].shared1.degree;
                }
                iVar29 = iVar29 + iVar18;
                Row[iVar14].shared2.mark = -(uint)(iVar29 == 0) | iVar12 + iVar29;
              }
              piVar16 = piVar16 + 1;
            } while (piVar16 < piVar4);
          }
          piVar11 = piVar11 + 1;
        } while (piVar11 < piVar3);
      }
      piVar11 = piVar10;
      if (0 < iVar6) {
        do {
          iVar18 = *piVar11;
          pcVar2 = Col + iVar18;
          piVar16 = A + pcVar2->start;
          piVar4 = piVar16 + pcVar2->length;
          uVar7 = 0;
          piVar27 = piVar16;
          iVar14 = 0;
          while (piVar27 < piVar4) {
            iVar29 = *piVar27;
            piVar27 = piVar27 + 1;
            iVar17 = Row[iVar29].shared2.mark;
            if (-1 < iVar17) {
              *piVar16 = iVar29;
              piVar16 = piVar16 + 1;
              uVar7 = uVar7 + iVar29;
              iVar14 = (iVar14 - iVar12) + iVar17;
              if (n_col <= iVar14) {
                iVar14 = n_col;
              }
            }
          }
          iVar29 = (int)((ulong)((long)piVar16 - (long)(A + (uint)pcVar2->start)) >> 2);
          pcVar2->length = iVar29;
          if (iVar29 == 0) {
            pcVar2->start = -1;
            rp_end._4_4_ = rp_end._4_4_ - (pcVar2->shared1).thickness;
            (pcVar2->shared2).score = iVar23;
            iVar23 = iVar23 + (pcVar2->shared1).thickness;
          }
          else {
            (pcVar2->shared2).score = iVar14;
            uVar28 = (ulong)uVar7 % (ulong)(n_col + 1);
            lVar21 = (long)head[uVar28];
            if (lVar21 < 0) {
              aVar8.headhash = -2 - head[uVar28];
              head[uVar28] = -2 - iVar18;
            }
            else {
              aVar8 = Col[lVar21].shared3;
              Col[lVar21].shared3.headhash = iVar18;
            }
            pcVar2->shared4 = (anon_union_4_2_db423fdf_for_shared4)aVar8;
            (pcVar2->shared3).headhash = (int)uVar28;
          }
          piVar11 = piVar11 + 1;
        } while (piVar11 < piVar3);
      }
      piVar11 = piVar10;
      if (0 < iVar6) {
        do {
          if (-1 < Col[*piVar11].start) {
            iVar6 = Col[*piVar11].shared3.headhash;
            iVar18 = head[iVar6];
            lVar21 = (long)iVar18;
            if (lVar21 < 0) {
              iVar14 = -2 - iVar18;
            }
            else {
              iVar14 = Col[lVar21].shared3.headhash;
            }
            while (iVar14 != -1) {
              pcVar2 = Col + iVar14;
              iVar29 = (pcVar2->shared4).degree_next;
              if (iVar29 != -1) {
                uVar7 = Col[iVar14].length;
                iVar17 = iVar14;
                do {
                  pcVar5 = Col + iVar29;
                  iVar19 = iVar29;
                  if ((pcVar5->length == uVar7) &&
                     ((pcVar5->shared2).score == (pcVar2->shared2).score)) {
                    if ((int)uVar7 < 1) {
                      uVar28 = 0;
                    }
                    else {
                      uVar28 = 0;
                      do {
                        if (A[(long)pcVar2->start + uVar28] != A[(long)pcVar5->start + uVar28])
                        goto LAB_00164b7f;
                        uVar28 = uVar28 + 1;
                      } while (uVar7 != (uint)uVar28);
                      uVar28 = (ulong)uVar7;
                    }
LAB_00164b7f:
                    if ((uint)uVar28 == uVar7) {
                      (pcVar2->shared1).thickness =
                           (pcVar2->shared1).thickness + (pcVar5->shared1).thickness;
                      (pcVar5->shared1).thickness = iVar14;
                      pcVar5->start = -2;
                      (pcVar5->shared2).score = -1;
                      Col[iVar17].shared4 = pcVar5->shared4;
                      iVar19 = iVar17;
                    }
                  }
                  iVar29 = (pcVar5->shared4).degree_next;
                  iVar17 = iVar19;
                } while (iVar29 != -1);
              }
              iVar14 = (pcVar2->shared4).degree_next;
            }
            paVar20 = &Col[lVar21].shared3;
            if (iVar18 < 0) {
              paVar20 = (anon_union_4_3_eabe2f71_for_shared3 *)(head + iVar6);
            }
            paVar20->headhash = -1;
          }
          piVar11 = piVar11 + 1;
        } while (piVar11 < piVar3);
      }
      iVar6 = max_deg + iVar12 + 1;
      iVar12 = 1;
      if (iVar6 < (int)(n_col ^ 0x7fffffffU)) {
        iVar12 = iVar6;
      }
      pcVar1->start = -1;
      piVar11 = piVar10;
      piVar16 = piVar10;
      if ((0 < n_row) && ((int)(n_col ^ 0x7fffffffU) <= iVar6)) {
        lVar21 = 0;
        do {
          if (-1 < *(int *)((long)&Row->shared2 + lVar21)) {
            *(undefined4 *)((long)&Row->shared2 + lVar21) = 0;
          }
          lVar21 = lVar21 + 0x10;
        } while (lVar15 != lVar21);
        iVar12 = 1;
      }
      while (iVar6 = iVar25, piVar16 < piVar3) {
        iVar18 = *piVar16;
        piVar16 = piVar16 + 1;
        iVar25 = iVar6;
        if (-1 < Col[iVar18].start) {
          pcVar1 = Col + iVar18;
          *piVar11 = iVar18;
          iVar25 = pcVar1->length;
          pcVar1->length = iVar25 + 1;
          A[(long)pcVar1->start + (long)iVar25] = local_40;
          iVar14 = n_col - (iVar23 + (pcVar1->shared1).thickness);
          iVar25 = ((pcVar1->shared2).score + rp_end._4_4_) - (pcVar1->shared1).thickness;
          if (iVar14 <= iVar25) {
            iVar25 = iVar14;
          }
          (pcVar1->shared2).score = iVar25;
          iVar14 = head[iVar25];
          (pcVar1->shared4).degree_next = iVar14;
          (pcVar1->shared3).headhash = -1;
          if ((long)iVar14 != -1) {
            Col[iVar14].shared3.headhash = iVar18;
          }
          piVar11 = piVar11 + 1;
          head[iVar25] = iVar18;
          if (iVar6 < iVar25) {
            iVar25 = iVar6;
          }
        }
      }
      if (0 < rp_end._4_4_) {
        lVar21 = (long)local_40;
        Row[lVar21].start = iVar30;
        Row[lVar21].length = (int)((ulong)((long)piVar11 - (long)piVar10) >> 2);
        Row[lVar21].shared1.degree = rp_end._4_4_;
        Row[lVar21].shared2.mark = 0;
      }
    } while (iVar23 < n_col2);
  }
  return iVar13;
}

Assistant:

static Index find_ordering /* return the number of garbage collections */
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Index Alen,     /* size of A, 2*nnz + n_col or larger */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    Index n_col2,     /* Remaining columns to order */
    Index max_deg,    /* Maximum row degree */
    Index pfree     /* index of first free slot (2*nnz on entry) */
    )
{
  /* === Local variables ================================================== */

  Index k ;     /* current pivot ordering step */
  Index pivot_col ;   /* current pivot column */
  Index *cp ;     /* a column pointer */
  Index *rp ;     /* a row pointer */
  Index pivot_row ;   /* current pivot row */
  Index *new_cp ;   /* modified column pointer */
  Index *new_rp ;   /* modified row pointer */
  Index pivot_row_start ; /* pointer to start of pivot row */
  Index pivot_row_degree ;  /* number of columns in pivot row */
  Index pivot_row_length ;  /* number of supercolumns in pivot row */
  Index pivot_col_score ; /* score of pivot column */
  Index needed_memory ;   /* free space needed for pivot row */
  Index *cp_end ;   /* pointer to the end of a column */
  Index *rp_end ;   /* pointer to the end of a row */
  Index row ;     /* a row index */
  Index col ;     /* a column index */
  Index max_score ;   /* maximum possible score */
  Index cur_score ;   /* score of current column */
  unsigned int hash ;   /* hash value for supernode detection */
  Index head_column ;   /* head of hash bucket */
  Index first_col ;   /* first column in hash bucket */
  Index tag_mark ;    /* marker value for mark array */
  Index row_mark ;    /* Row [row].shared2.mark */
  Index set_difference ;  /* set difference size of row with pivot row */
  Index min_score ;   /* smallest column score */
  Index col_thickness ;   /* "thickness" (no. of columns in a supercol) */
  Index max_mark ;    /* maximum value of tag_mark */
  Index pivot_col_thickness ; /* number of columns represented by pivot col */
  Index prev_col ;    /* Used by Dlist operations. */
  Index next_col ;    /* Used by Dlist operations. */
  Index ngarbage ;    /* number of garbage collections performed */


  /* === Initialization and clear mark ==================================== */

  max_mark = INT_MAX - n_col ;  /* INT_MAX defined in <limits.h> */
  tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
  min_score = 0 ;
  ngarbage = 0 ;
  COLAMD_DEBUG1 (("colamd: Ordering, n_col2=%d\n", n_col2)) ;

  /* === Order the columns ================================================ */

  for (k = 0 ; k < n_col2 ; /* 'k' is incremented below */)
  {

    /* === Select pivot column, and order it ============================ */

    /* make sure degree list isn't empty */
    COLAMD_ASSERT (min_score >= 0) ;
    COLAMD_ASSERT (min_score <= n_col) ;
    COLAMD_ASSERT (head [min_score] >= COLAMD_EMPTY) ;

    /* get pivot column from head of minimum degree list */
    while (head [min_score] == COLAMD_EMPTY && min_score < n_col)
    {
      min_score++ ;
    }
    pivot_col = head [min_score] ;
    COLAMD_ASSERT (pivot_col >= 0 && pivot_col <= n_col) ;
    next_col = Col [pivot_col].shared4.degree_next ;
    head [min_score] = next_col ;
    if (next_col != COLAMD_EMPTY)
    {
      Col [next_col].shared3.prev = COLAMD_EMPTY ;
    }

    COLAMD_ASSERT (COL_IS_ALIVE (pivot_col)) ;
    COLAMD_DEBUG3 (("Pivot col: %d\n", pivot_col)) ;

    /* remember score for defrag check */
    pivot_col_score = Col [pivot_col].shared2.score ;

    /* the pivot column is the kth column in the pivot order */
    Col [pivot_col].shared2.order = k ;

    /* increment order count by column thickness */
    pivot_col_thickness = Col [pivot_col].shared1.thickness ;
    k += pivot_col_thickness ;
    COLAMD_ASSERT (pivot_col_thickness > 0) ;

    /* === Garbage_collection, if necessary ============================= */

    needed_memory = COLAMD_MIN (pivot_col_score, n_col - k) ;
    if (pfree + needed_memory >= Alen)
    {
      pfree = Eigen::internal::garbage_collection (n_row, n_col, Row, Col, A, &A [pfree]) ;
      ngarbage++ ;
      /* after garbage collection we will have enough */
      COLAMD_ASSERT (pfree + needed_memory < Alen) ;
      /* garbage collection has wiped out the Row[].shared2.mark array */
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;

    }

    /* === Compute pivot row pattern ==================================== */

    /* get starting location for this new merged row */
    pivot_row_start = pfree ;

    /* initialize new row counts to zero */
    pivot_row_degree = 0 ;

    /* tag pivot column as having been visited so it isn't included */
    /* in merged pivot row */
    Col [pivot_col].shared1.thickness = -pivot_col_thickness ;

    /* pivot row is the union of all rows in the pivot column pattern */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      COLAMD_DEBUG4 (("Pivot col pattern %d %d\n", ROW_IS_ALIVE (row), row)) ;
      /* skip if row is dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      rp = &A [Row [row].start] ;
      rp_end = rp + Row [row].length ;
      while (rp < rp_end)
      {
	/* get a column */
	col = *rp++ ;
	/* add the column, if alive and untagged */
	col_thickness = Col [col].shared1.thickness ;
	if (col_thickness > 0 && COL_IS_ALIVE (col))
	{
	  /* tag column in pivot row */
	  Col [col].shared1.thickness = -col_thickness ;
	  COLAMD_ASSERT (pfree < Alen) ;
	  /* place column in pivot row */
	  A [pfree++] = col ;
	  pivot_row_degree += col_thickness ;
	}
      }
    }

    /* clear tag on pivot column */
    Col [pivot_col].shared1.thickness = pivot_col_thickness ;
    max_deg = COLAMD_MAX (max_deg, pivot_row_degree) ;


    /* === Kill all rows used to construct pivot row ==================== */

    /* also kill pivot row, temporarily */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* may be killing an already dead row */
      row = *cp++ ;
      COLAMD_DEBUG3 (("Kill row in pivot col: %d\n", row)) ;
      KILL_ROW (row) ;
    }

    /* === Select a row index to use as the new pivot row =============== */

    pivot_row_length = pfree - pivot_row_start ;
    if (pivot_row_length > 0)
    {
      /* pick the "pivot" row arbitrarily (first row in col) */
      pivot_row = A [Col [pivot_col].start] ;
      COLAMD_DEBUG3 (("Pivotal row is %d\n", pivot_row)) ;
    }
    else
    {
      /* there is no pivot row, since it is of zero length */
      pivot_row = COLAMD_EMPTY ;
      COLAMD_ASSERT (pivot_row_length == 0) ;
    }
    COLAMD_ASSERT (Col [pivot_col].length > 0 || pivot_row_length == 0) ;

    /* === Approximate degree computation =============================== */

    /* Here begins the computation of the approximate degree.  The column */
    /* score is the sum of the pivot row "length", plus the size of the */
    /* set differences of each row in the column minus the pattern of the */
    /* pivot row itself.  The column ("thickness") itself is also */
    /* excluded from the column score (we thus use an approximate */
    /* external degree). */

    /* The time taken by the following code (compute set differences, and */
    /* add them up) is proportional to the size of the data structure */
    /* being scanned - that is, the sum of the sizes of each column in */
    /* the pivot row.  Thus, the amortized time to compute a column score */
    /* is proportional to the size of that column (where size, in this */
    /* context, is the column "length", or the number of row indices */
    /* in that column).  The number of row indices in a column is */
    /* monotonically non-decreasing, from the length of the original */
    /* column on input to colamd. */

    /* === Compute set differences ====================================== */

    COLAMD_DEBUG3 (("** Computing set differences phase. **\n")) ;

    /* pivot row is currently dead - it will be revived later. */

    COLAMD_DEBUG3 (("Pivot row: ")) ;
    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      COLAMD_DEBUG3 (("Col: %d\n", col)) ;

      /* clear tags used to construct pivot row pattern */
      col_thickness = -Col [col].shared1.thickness ;
      COLAMD_ASSERT (col_thickness > 0) ;
      Col [col].shared1.thickness = col_thickness ;

      /* === Remove column from degree list =========================== */

      cur_score = Col [col].shared2.score ;
      prev_col = Col [col].shared3.prev ;
      next_col = Col [col].shared4.degree_next ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= COLAMD_EMPTY) ;
      if (prev_col == COLAMD_EMPTY)
      {
	head [cur_score] = next_col ;
      }
      else
      {
	Col [prev_col].shared4.degree_next = next_col ;
      }
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = prev_col ;
      }

      /* === Scan the column ========================================== */

      cp = &A [Col [col].start] ;
      cp_end = cp + Col [col].length ;
      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row != pivot_row) ;
	set_difference = row_mark - tag_mark ;
	/* check if the row has been seen yet */
	if (set_difference < 0)
	{
	  COLAMD_ASSERT (Row [row].shared1.degree <= max_deg) ;
	  set_difference = Row [row].shared1.degree ;
	}
	/* subtract column thickness from this row's set difference */
	set_difference -= col_thickness ;
	COLAMD_ASSERT (set_difference >= 0) ;
	/* absorb this row if the set difference becomes zero */
	if (set_difference == 0)
	{
	  COLAMD_DEBUG3 (("aggressive absorption. Row: %d\n", row)) ;
	  KILL_ROW (row) ;
	}
	else
	{
	  /* save the new mark */
	  Row [row].shared2.mark = set_difference + tag_mark ;
	}
      }
    }


    /* === Add up set differences for each column ======================= */

    COLAMD_DEBUG3 (("** Adding set differences phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      /* get a column */
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      hash = 0 ;
      cur_score = 0 ;
      cp = &A [Col [col].start] ;
      /* compact the column */
      new_cp = cp ;
      cp_end = cp + Col [col].length ;

      COLAMD_DEBUG4 (("Adding set diffs for Col: %d.\n", col)) ;

      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	COLAMD_ASSERT(row >= 0 && row < n_row) ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row_mark > tag_mark) ;
	/* compact the column */
	*new_cp++ = row ;
	/* compute hash function */
	hash += row ;
	/* add set difference */
	cur_score += row_mark - tag_mark ;
	/* integer overflow... */
	cur_score = COLAMD_MIN (cur_score, n_col) ;
      }

      /* recompute the column's length */
      Col [col].length = (Index) (new_cp - &A [Col [col].start]) ;

      /* === Further mass elimination ================================= */

      if (Col [col].length == 0)
      {
	COLAMD_DEBUG4 (("further mass elimination. Col: %d\n", col)) ;
	/* nothing left but the pivot row in this column */
	KILL_PRINCIPAL_COL (col) ;
	pivot_row_degree -= Col [col].shared1.thickness ;
	COLAMD_ASSERT (pivot_row_degree >= 0) ;
	/* order it */
	Col [col].shared2.order = k ;
	/* increment order count by column thickness */
	k += Col [col].shared1.thickness ;
      }
      else
      {
	/* === Prepare for supercolumn detection ==================== */

	COLAMD_DEBUG4 (("Preparing supercol detection for Col: %d.\n", col)) ;

	/* save score so far */
	Col [col].shared2.score = cur_score ;

	/* add column to hash table, for supercolumn detection */
	hash %= n_col + 1 ;

	COLAMD_DEBUG4 ((" Hash = %d, n_col = %d.\n", hash, n_col)) ;
	COLAMD_ASSERT (hash <= n_col) ;

	head_column = head [hash] ;
	if (head_column > COLAMD_EMPTY)
	{
	  /* degree list "hash" is non-empty, use prev (shared3) of */
	  /* first column in degree list as head of hash bucket */
	  first_col = Col [head_column].shared3.headhash ;
	  Col [head_column].shared3.headhash = col ;
	}
	else
	{
	  /* degree list "hash" is empty, use head as hash bucket */
	  first_col = - (head_column + 2) ;
	  head [hash] = - (col + 2) ;
	}
	Col [col].shared4.hash_next = first_col ;

	/* save hash function in Col [col].shared3.hash */
	Col [col].shared3.hash = (Index) hash ;
	COLAMD_ASSERT (COL_IS_ALIVE (col)) ;
      }
    }

    /* The approximate external column degree is now computed.  */

    /* === Supercolumn detection ======================================== */

    COLAMD_DEBUG3 (("** Supercolumn detection phase. **\n")) ;

    Eigen::internal::detect_super_cols (Col, A, head, pivot_row_start, pivot_row_length) ;

    /* === Kill the pivotal column ====================================== */

    KILL_PRINCIPAL_COL (pivot_col) ;

    /* === Clear mark =================================================== */

    tag_mark += (max_deg + 1) ;
    if (tag_mark >= max_mark)
    {
      COLAMD_DEBUG2 (("clearing tag_mark\n")) ;
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
    }

    /* === Finalize the new pivot row, and column scores ================ */

    COLAMD_DEBUG3 (("** Finalize scores phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    /* compact the pivot row */
    new_rp = rp ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      /* skip dead columns */
      if (COL_IS_DEAD (col))
      {
	continue ;
      }
      *new_rp++ = col ;
      /* add new pivot row to column */
      A [Col [col].start + (Col [col].length++)] = pivot_row ;

      /* retrieve score so far and add on pivot row's degree. */
      /* (we wait until here for this in case the pivot */
      /* row's degree was reduced due to mass elimination). */
      cur_score = Col [col].shared2.score + pivot_row_degree ;

      /* calculate the max possible score as the number of */
      /* external columns minus the 'k' value minus the */
      /* columns thickness */
      max_score = n_col - k - Col [col].shared1.thickness ;

      /* make the score the external degree of the union-of-rows */
      cur_score -= Col [col].shared1.thickness ;

      /* make sure score is less or equal than the max score */
      cur_score = COLAMD_MIN (cur_score, max_score) ;
      COLAMD_ASSERT (cur_score >= 0) ;

      /* store updated score */
      Col [col].shared2.score = cur_score ;

      /* === Place column back in degree list ========================= */

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (head [cur_score] >= COLAMD_EMPTY) ;
      next_col = head [cur_score] ;
      Col [col].shared4.degree_next = next_col ;
      Col [col].shared3.prev = COLAMD_EMPTY ;
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = col ;
      }
      head [cur_score] = col ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, cur_score) ;

    }

    /* === Resurrect the new pivot row ================================== */

    if (pivot_row_degree > 0)
    {
      /* update pivot row length to reflect any cols that were killed */
      /* during super-col detection and mass elimination */
      Row [pivot_row].start  = pivot_row_start ;
      Row [pivot_row].length = (Index) (new_rp - &A[pivot_row_start]) ;
      Row [pivot_row].shared1.degree = pivot_row_degree ;
      Row [pivot_row].shared2.mark = 0 ;
      /* pivot row is no longer dead */
    }
  }

  /* === All principal columns have now been ordered ====================== */

  return (ngarbage) ;
}